

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O2

DWORD SuperFastHash(char *data,size_t len)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (data == (char *)0x0 || len == 0) {
    return 0;
  }
  uVar3 = len & 0xfffffffffffffffc;
  uVar1 = 0;
  for (uVar4 = 0; len >> 2 != uVar4; uVar4 = uVar4 + 1) {
    uVar1 = (uVar1 + *(ushort *)(data + uVar4 * 4)) * 0x10000 ^
            (uint)*(ushort *)(data + uVar4 * 4 + 2) << 0xb ^ uVar1 + *(ushort *)(data + uVar4 * 4);
    uVar1 = uVar1 + (uVar1 >> 0xb);
  }
  switch((uint)len & 3) {
  case 0:
    goto switchD_0042a510_caseD_0;
  case 1:
    uVar2 = (uVar1 + (int)data[uVar3]) * 0x400 ^ uVar1 + (int)data[uVar3];
    uVar1 = uVar2 >> 1;
    break;
  case 2:
    uVar2 = (uVar1 + *(ushort *)(data + uVar3)) * 0x800 ^ uVar1 + *(ushort *)(data + uVar3);
    uVar1 = uVar2 >> 0x11;
    break;
  case 3:
    uVar1 = (uVar1 + *(ushort *)(data + uVar3)) * 0x10000 ^
            (int)data[uVar3 + 2] << 0x12 ^ uVar1 + *(ushort *)(data + uVar3);
    uVar1 = (uVar1 >> 0xb) + uVar1;
    goto switchD_0042a510_caseD_0;
  }
  uVar1 = uVar1 + uVar2;
switchD_0042a510_caseD_0:
  uVar1 = uVar1 * 8 ^ uVar1;
  uVar1 = (uVar1 >> 5) + uVar1;
  uVar1 = uVar1 * 0x10 ^ uVar1;
  uVar1 = (uVar1 >> 0x11) + uVar1;
  uVar1 = uVar1 * 0x2000000 ^ uVar1;
  return (uVar1 >> 6) + uVar1;
}

Assistant:

DWORD SuperFastHash (const char *data, size_t len)
{
	DWORD hash = 0, tmp;
	size_t rem;

	if (len == 0 || data == NULL) return 0;

	rem = len & 3;
	len >>= 2;

	/* Main loop */
	for (;len > 0; len--)
	{
		hash  += get16bits (data);
		tmp    = (get16bits (data+2) << 11) ^ hash;
		hash   = (hash << 16) ^ tmp;
		data  += 2*sizeof (WORD);
		hash  += hash >> 11;
	}

	/* Handle end cases */
	switch (rem)
	{
		case 3:	hash += get16bits (data);
				hash ^= hash << 16;
				hash ^= data[sizeof (WORD)] << 18;
				hash += hash >> 11;
				break;
		case 2:	hash += get16bits (data);
				hash ^= hash << 11;
				hash += hash >> 17;
				break;
		case 1: hash += *data;
				hash ^= hash << 10;
				hash += hash >> 1;
	}

	/* Force "avalanching" of final 127 bits */
	hash ^= hash << 3;
	hash += hash >> 5;
	hash ^= hash << 4;
	hash += hash >> 17;
	hash ^= hash << 25;
	hash += hash >> 6;

	return hash;
}